

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListWidgetPrivate::setup(QListWidgetPrivate *this)

{
  QAbstractItemView *this_00;
  QListModel *this_01;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  Object local_30 [8];
  Object local_28 [8];
  QWidgetData *local_20;
  
  local_20 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  this_01 = (QListModel *)operator_new(0x40);
  QListModel::QListModel(this_01,(QListWidget *)this_00);
  QAbstractItemView::setModel(this_00,(QAbstractItemModel *)this_01);
  type = (ConnectionType)this;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_60,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::pressed,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_60 + 8),(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::clicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_50,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::doubleClicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_50 + 8),(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::activated,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_40,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::entered,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_40 + 8),
             (offset_in_QAbstractItemModel_to_subr)
             (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QListWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (local_30,(offset_in_QAbstractItemModel_to_subr)
                      (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QListWidgetPrivate::*)()>
            (local_28,(offset_in_QAbstractItemModel_to_subr)
                      (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::columnsRemoved,0,type);
  std::array<QMetaObject::Connection,_8UL>::operator=
            (&this->connections,(array<QMetaObject::Connection,_8UL> *)local_60);
  std::array<QMetaObject::Connection,_8UL>::~array((array<QMetaObject::Connection,_8UL> *)local_60);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::setup()
{
    Q_Q(QListWidget);
    q->QListView::setModel(new QListModel(q));
    // view signals
    connections = {
        QObjectPrivate::connect(q, &QListWidget::pressed,
                                this, &QListWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QListWidget::clicked,
                                this, &QListWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QListWidget::doubleClicked,
                                this, &QListWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QListWidget::activated,
                                this, &QListWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QListWidget::entered,
                                this, &QListWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QListWidgetPrivate::sort)
    };
}